

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Get_block_info(int g_a,int *num_blocks,int *block_dims)

{
  Integer IVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  Integer _ga_lo [7];
  Integer _ga_work [7];
  Integer local_98 [8];
  Integer local_58 [7];
  
  IVar1 = pnga_get_dimension((long)g_a);
  pnga_get_block_info((long)g_a,local_58,local_98);
  lVar3 = 0;
  lVar2 = 0;
  if (0 < IVar1) {
    lVar2 = IVar1;
  }
  piVar4 = num_blocks + IVar1;
  for (; piVar4 = piVar4 + -1, lVar2 != lVar3; lVar3 = lVar3 + 1) {
    *piVar4 = (int)local_58[lVar3];
  }
  piVar4 = block_dims + IVar1;
  for (lVar3 = 0; piVar4 = piVar4 + -1, lVar2 != lVar3; lVar3 = lVar3 + 1) {
    *piVar4 = (int)local_98[lVar3];
  }
  return;
}

Assistant:

void NGA_Get_block_info(int g_a, int num_blocks[], int block_dims[])
{
     Integer aa, ndim;
     Integer _ga_work[MAXDIM], _ga_lo[MAXDIM];
     aa = (Integer)g_a;
     ndim = wnga_get_dimension(aa);
     wnga_get_block_info(aa, _ga_work, _ga_lo);
     COPYF2C(_ga_work,num_blocks, ndim);
     COPYF2C(_ga_lo,block_dims, ndim);
}